

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::EnumDescriptorProto::MergePartialFromCodedStream
          (EnumDescriptorProto *this,CodedInputStream *input)

{
  bool bVar1;
  uint uVar2;
  string *value;
  Type *value_00;
  uint8 *puVar3;
  EnumOptions *value_01;
  uint uVar4;
  uint32 tag;
  
LAB_001f3eb2:
  do {
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar3 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar4 = tag >> 3;
    uVar2 = tag & 7;
    if (uVar4 != 3) {
      if (uVar4 == 2) {
        if (uVar2 == 2) goto LAB_001f3f74;
      }
      else if ((uVar4 == 1) && (uVar2 == 2)) {
        value = mutable_name_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,value);
        if (!bVar1) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x12')) {
          do {
            input->buffer_ = puVar3 + 1;
LAB_001f3f74:
            value_00 = internal::RepeatedPtrFieldBase::
                       Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                                 (&(this->value_).super_RepeatedPtrFieldBase);
            bVar1 = internal::WireFormatLite::
                    ReadMessageNoVirtual<google::protobuf::EnumValueDescriptorProto>(input,value_00)
            ;
            if (!bVar1) {
              return false;
            }
            puVar3 = input->buffer_;
            if (input->buffer_end_ <= puVar3) goto LAB_001f3eb2;
          } while (*puVar3 == '\x12');
          if (*puVar3 == '\x1a') {
            input->buffer_ = puVar3 + 1;
            goto LAB_001f3fb7;
          }
        }
        goto LAB_001f3eb2;
      }
LAB_001f3f56:
      if (uVar2 == 4) {
        return true;
      }
      bVar1 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      if (!bVar1) {
        return false;
      }
      goto LAB_001f3eb2;
    }
    if (uVar2 != 2) goto LAB_001f3f56;
LAB_001f3fb7:
    value_01 = mutable_options(this);
    bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::EnumOptions>
                      (input,value_01);
    if (!bVar1) {
      return false;
    }
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool EnumDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        break;
      }

      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}